

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

char * read_opts(int argc,char **argv)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  char *__s1;
  ulong uVar4;
  char *pcVar5;
  size_t sStack_40;
  char *local_38;
  
  if ((argc < 2) && (iVar2 = isatty(0), iVar2 != 0)) {
switchD_002454a3_caseD_68:
    usage();
LAB_002457bd:
    pcVar5 = "-x accepts only 0, 1 and 2\n";
    sStack_40 = 0x1b;
LAB_00245844:
    fwrite(pcVar5,sStack_40,1,_stderr);
    exit(1);
  }
  iVar2 = 1;
  pager_enabled = isatty(1);
  colors = &envy_def_colors;
  if (pager_enabled == 0) {
    colors = &envy_null_colors;
  }
  local_38 = (char *)0x0;
switchD_002454a3_caseD_62:
  iVar3 = getopt(argc,argv,"m:o:g:qac:l:i:r:he:d:p:s:x:");
  pbVar1 = _optarg;
  switch(iVar3) {
  case 0x61:
    _filter_all_classes(0);
  case 0x62:
  case 0x66:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
    goto switchD_002454a3_caseD_62;
  case 99:
    if (*_optarg == 0x30) {
      colors = &envy_null_colors;
      goto switchD_002454a3_caseD_62;
    }
    if (*_optarg == 0x31) {
      colors = &envy_def_colors;
      goto switchD_002454a3_caseD_62;
    }
    pcVar5 = "-c accepts only 0 and 1\n";
    break;
  case 100:
    handle_filter_opt((char *)_optarg,0);
    goto switchD_002454a3_caseD_62;
  case 0x65:
    handle_filter_opt((char *)_optarg,1);
    goto switchD_002454a3_caseD_62;
  case 0x67:
    if (*_optarg == 0x30) {
      print_gpu_addresses = 0;
      goto switchD_002454a3_caseD_62;
    }
    if (*_optarg == 0x31) {
      print_gpu_addresses = 1;
      goto switchD_002454a3_caseD_62;
    }
    pcVar5 = "-g accepts only 0 and 1\n";
    break;
  case 0x68:
    goto switchD_002454a3_caseD_68;
  case 0x69:
    if (*_optarg == 0x30) {
      indent_logs = 0;
      goto switchD_002454a3_caseD_62;
    }
    if (*_optarg == 0x31) {
      indent_logs = 1;
      goto switchD_002454a3_caseD_62;
    }
    pcVar5 = "-i accepts only 0 and 1\n";
    break;
  case 0x6c:
    local_38 = strdup((char *)_optarg);
    pcVar5 = strdup(local_38);
    __s1 = __xpg_basename(pcVar5);
    if ((chipset == 0) && (iVar3 = strncasecmp(__s1,"nv",2), iVar3 == 0)) {
      uVar4 = strtoul(__s1 + 2,(char **)0x0,0x10);
      chipset = (int)uVar4;
    }
    free(pcVar5);
    goto switchD_002454a3_caseD_62;
  case 0x6d:
    iVar3 = strncasecmp((char *)_optarg,"NV",2);
    uVar4 = strtoul((char *)(pbVar1 + (ulong)(iVar3 == 0) * 2),(char **)0x0,0x10);
    chipset = (int)uVar4;
    goto switchD_002454a3_caseD_62;
  case 0x6f:
    if (*_optarg == 0x30) {
      dump_raw_ioctl_data = 0;
      goto switchD_002454a3_caseD_62;
    }
    if (*_optarg == 0x31) {
      dump_raw_ioctl_data = 1;
      goto switchD_002454a3_caseD_62;
    }
    pcVar5 = "-o accepts only 0 and 1\n";
    break;
  case 0x70:
    if (*_optarg == 0x30) {
      pager_enabled = 0;
      goto switchD_002454a3_caseD_62;
    }
    if (*_optarg == 0x31) {
      pager_enabled = 1;
      goto switchD_002454a3_caseD_62;
    }
    pcVar5 = "-p accepts only 0 and 1\n";
    break;
  case 0x71:
    handle_filter_opt("all",0);
    dump_tsc = iVar2;
    dump_tic = iVar2;
    dump_cp = iVar2;
    decode_pb = iVar2;
    handle_filter_opt("shader",1);
    handle_filter_opt("macro",1);
    dump_buffer_usage = iVar2;
    _filter_all_classes(1);
    nvrm_describe_classes = iVar2;
    goto switchD_002454a3_caseD_62;
  case 0x72:
    if (*_optarg == 0x30) {
      macro_rt_verbose = 0;
      goto switchD_002454a3_caseD_62;
    }
    if (*_optarg == 0x31) {
      macro_rt_verbose = 1;
      goto switchD_002454a3_caseD_62;
    }
    pcVar5 = "-r accepts only 0 and 1\n";
    break;
  case 0x73:
    mmt_sync_fd = open((char *)_optarg,1);
    goto switchD_002454a3_caseD_62;
  case 0x78:
    if (*_optarg != 0x30) {
      if (1 < *_optarg - 0x31) goto LAB_002457bd;
      pcVar5 = "demmt needs libseccomp to enable sandboxing\n";
      sStack_40 = 0x2c;
      goto LAB_00245844;
    }
    seccomp_level = 0;
    goto switchD_002454a3_caseD_62;
  default:
    goto switchD_002454a3_default;
  }
  sStack_40 = 0x18;
  goto LAB_00245844;
switchD_002454a3_default:
  if (iVar3 == -1) {
    return local_38;
  }
  if (iVar3 != 0x3f) goto switchD_002454a3_caseD_62;
  goto switchD_002454a3_caseD_68;
}

Assistant:

char *read_opts(int argc, char *argv[])
{
	char *filename = NULL;

	if (argc < 2 && isatty(0))
		usage();

	pager_enabled = isatty(1);
	if (pager_enabled)
		colors = &envy_def_colors;
	else
		colors = &envy_null_colors;

	int c;
	while ((c = getopt (argc, argv, "m:o:g:qac:l:i:r:he:d:p:s:x:")) != -1)
	{
		switch (c)
		{
			case 'm':
			{
				char *chip = optarg;
				if (strncasecmp(chip, "NV", 2) == 0)
					chip += 2;
				chipset = strtoul(chip, NULL, 16);
				break;
			}
			case 'o':
				if (optarg[0] == '1')
					_filter_ioctl_raw(1);
				else if (optarg[0] == '0')
					_filter_ioctl_raw(0);
				else
				{
					fprintf(stderr, "-o accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'g':
				if (optarg[0] == '1')
					_filter_gpu_addr(1);
				else if (optarg[0] == '0')
					_filter_gpu_addr(0);
				else
				{
					fprintf(stderr, "-g accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'q':
				handle_filter_opt("all", 0);
				_filter_decode_pb(1);
				_filter_tsc(1);
				_filter_tic(1);
				_filter_cp(1);
				handle_filter_opt("shader", 1);
				handle_filter_opt("macro", 1);
				_filter_buffer_usage(1);
				_filter_all_classes(1);
				_filter_nvrm_describe_classes(1);
				break;
			case 'a':
				_filter_all_classes(0);
				break;
			case 'c':
				if (optarg[0] == '1')
					colors = &envy_def_colors;
				else if (optarg[0] == '0')
					colors = &envy_null_colors;
				else
				{
					fprintf(stderr, "-c accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'l':
			{
				filename = strdup(optarg);
				char *maybe_chipset = strdup(filename);
				const char *base = basename(maybe_chipset);
				if (chipset == 0 && strncasecmp(base, "nv", 2) == 0)
					chipset = strtoul(base + 2, NULL, 16);
				free(maybe_chipset);
				break;
			}
			case 'i':
				if (optarg[0] == '1')
					indent_logs = 1;
				else if (optarg[0] == '0')
					indent_logs = 0;
				else
				{
					fprintf(stderr, "-i accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'r':
				if (optarg[0] == '1')
					_filter_macro_rt_verbose(1);
				else if (optarg[0] == '0')
					_filter_macro_rt_verbose(0);
				else
				{
					fprintf(stderr, "-r accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'p':
				if (optarg[0] == '1')
					_filter_pager_enabled(1);
				else if (optarg[0] == '0')
					_filter_pager_enabled(0);
				else
				{
					fprintf(stderr, "-p accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'x':
				if (optarg[0] == '1' || optarg[0] == '2')
				{
#ifdef LIBSECCOMP_AVAILABLE
					_filter_seccomp(optarg[0] - '1' + 1);
#else
					fprintf(stderr, "demmt needs libseccomp to enable sandboxing\n");
					exit(1);
#endif
				}
				else if (optarg[0] == '0')
					_filter_seccomp(0);
				else
				{
					fprintf(stderr, "-x accepts only 0, 1 and 2\n");
					exit(1);
				}
				break;
			case 'h':
			case '?':
				usage();
				break;
			case 'd':
				handle_filter_opt(optarg, 0);
				break;
			case 'e':
				handle_filter_opt(optarg, 1);
				break;
			case 's':
				mmt_sync_fd = open(optarg, O_WRONLY);
				break;
		}
	}

	return filename;
}